

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_texture_op(CompilerGLSL *this,Instruction *i,bool sparse)

{
  ushort uVar1;
  uint32_t id;
  uint32_t id_00;
  uint32_t id_01;
  uint *puVar2;
  uint32_t *puVar3;
  SPIRType *pSVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  char (*in_stack_fffffffffffffee0) [2];
  bool forward;
  uint32_t sparse_texel_id;
  uint32_t sparse_code_id;
  string local_108;
  string expr;
  string local_c8;
  string local_a8;
  spirv_cross local_88 [32];
  SmallVector<unsigned_int,_8UL> inherited_expressions;
  
  puVar3 = Compiler::stream(&this->super_Compiler,i);
  uVar1 = i->op;
  inherited_expressions.super_VectorView<unsigned_int>.ptr =
       (uint *)&inherited_expressions.stack_storage;
  inherited_expressions.super_VectorView<unsigned_int>.buffer_size = 0;
  inherited_expressions.buffer_capacity = 8;
  id = *puVar3;
  id_00 = puVar3[1];
  pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
  sparse_code_id = 0;
  sparse_texel_id = 0;
  if (sparse) {
    emit_sparse_feedback_temporaries(this,id,id_00,&sparse_code_id,&sparse_texel_id);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x11])(&expr,this,i,(ulong)sparse);
  id_01 = sparse_code_id;
  if (sparse) {
    to_expression_abi_cxx11_(&local_108,this,sparse_code_id,true);
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (this,&local_108,(char (*) [4])0x31e8c7,&expr,(char (*) [2])0x304bae);
    ::std::__cxx11::string::~string((string *)&local_108);
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_88,this,pSVar4,0);
    to_expression_abi_cxx11_(&local_a8,this,id_01,true);
    to_expression_abi_cxx11_(&local_c8,this,sparse_texel_id,true);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              (&local_108,local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31efa1,
               (char (*) [2])&local_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31b6f8,
               (char (*) [3])&local_c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ae46,
               in_stack_fffffffffffffee0);
    ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_108);
    ::std::__cxx11::string::~string((string *)&local_108);
    ::std::__cxx11::string::~string((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)local_88);
    inherited_expressions.super_VectorView<unsigned_int>.buffer_size = 0;
  }
  emit_op(this,id,id_00,&expr,sparse,false);
  puVar2 = inherited_expressions.super_VectorView<unsigned_int>.ptr;
  lVar5 = inherited_expressions.super_VectorView<unsigned_int>.buffer_size << 2;
  for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 4) {
    Compiler::inherit_expression_dependencies
              (&this->super_Compiler,id_00,*(uint32_t *)((long)puVar2 + lVar6));
  }
  uVar7 = uVar1 - 0x57;
  if ((uVar7 < 7) && ((0x55U >> (uVar7 & 0x1f) & 1) != 0)) {
    register_control_dependent_expression(this,id_00);
  }
  ::std::__cxx11::string::~string((string *)&expr);
  SmallVector<unsigned_int,_8UL>::~SmallVector(&inherited_expressions);
  return;
}

Assistant:

void CompilerGLSL::emit_texture_op(const Instruction &i, bool sparse)
{
	auto *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	SmallVector<uint32_t> inherited_expressions;

	uint32_t result_type_id = ops[0];
	uint32_t id = ops[1];
	auto &return_type = get<SPIRType>(result_type_id);

	uint32_t sparse_code_id = 0;
	uint32_t sparse_texel_id = 0;
	if (sparse)
		emit_sparse_feedback_temporaries(result_type_id, id, sparse_code_id, sparse_texel_id);

	bool forward = false;
	string expr = to_texture_op(i, sparse, &forward, inherited_expressions);

	if (sparse)
	{
		statement(to_expression(sparse_code_id), " = ", expr, ";");
		expr = join(type_to_glsl(return_type), "(", to_expression(sparse_code_id), ", ", to_expression(sparse_texel_id),
		            ")");
		forward = true;
		inherited_expressions.clear();
	}

	emit_op(result_type_id, id, expr, forward);
	for (auto &inherit : inherited_expressions)
		inherit_expression_dependencies(id, inherit);

	// Do not register sparse ops as control dependent as they are always lowered to a temporary.
	switch (op)
	{
	case OpImageSampleDrefImplicitLod:
	case OpImageSampleImplicitLod:
	case OpImageSampleProjImplicitLod:
	case OpImageSampleProjDrefImplicitLod:
		register_control_dependent_expression(id);
		break;

	default:
		break;
	}
}